

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_generic_services.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::no_generic_services_test::TestMessage::ByteSizeLong(TestMessage *this)

{
  int32_t value;
  uint32_t *puVar1;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMessage *this_;
  TestMessage *this_local;
  
  sStack_20 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    value = _internal_a(this);
    sVar2 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(value);
    sStack_20 = sVar2 + sStack_20;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestMessage::ByteSizeLong() const {
  const TestMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.no_generic_services_test.TestMessage)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // optional int32 a = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_a());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}